

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::EntryHasOwn(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var aValue;
  RecyclableObject *argument;
  int in_stack_00000010;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  PropertyString *propertyString;
  CallInfo callInfo_local;
  ArgumentReader args;
  RecyclableObject *dynamicObject;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  propertyString = (PropertyString *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x66,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cded06;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)&propertyString);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)propertyString & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x69,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00cded06:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Values = (Type)0x0;
  if (((ulong)callInfo_local & 0xfffffe) != 0) {
    aValue = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar4 = JavascriptConversion::ToObject
                      (aValue,pSVar1,(RecyclableObject **)&args.super_Arguments.Values);
    if (BVar4 != 0) {
      if ((callInfo_local._0_4_ & 0xffffff) == 2) {
        argument = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        argument = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,2);
      }
      JavascriptConversion::ToPropertyKey
                (argument,pSVar1,&local_50,(PropertyString **)&propertyRecord);
      BVar4 = JavascriptOperators::HasOwnProperty
                        (args.super_Arguments.Values,local_50->pid,pSVar1,
                         (PropertyString *)propertyRecord);
      return (&(((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               booleanTrue)[BVar4 == 0].ptr;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec36,L"Object.hasOwn");
}

Assistant:

Var JavascriptObject::EntryHasOwn(RecyclableObject* function, CallInfo callInfo, ...)
{
    JIT_HELPER_REENTRANT_HEADER(Object_HasOwn);
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    RecyclableObject* dynamicObject = nullptr;
    // first parameter must exist and be an object coercible or throw type error
    if (args.Info.Count < 2 || FALSE == JavascriptConversion::ToObject(args[1], scriptContext, &dynamicObject))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Object.hasOwn"));
    }

    // if there is only one parameter use undefined as the property to query
    Var propertyName = args.Info.Count == 2 ? scriptContext->GetLibrary()->GetUndefined() : args[2];

    const PropertyRecord* propertyRecord;
    PropertyString* propertyString;
    JavascriptConversion::ToPropertyKey(propertyName, scriptContext, &propertyRecord, &propertyString);

    if (JavascriptOperators::HasOwnProperty(dynamicObject, propertyRecord->GetPropertyId(), scriptContext, propertyString))
    {
        return scriptContext->GetLibrary()->GetTrue();
    }

    return scriptContext->GetLibrary()->GetFalse();
    JIT_HELPER_END(Object_HasOwn);
}